

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O0

bool anon_unknown.dwarf_263068::EncodeECPrivateKey
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,EC_KEY *key)

{
  undefined8 key_00;
  int iVar1;
  uint enc_flags;
  cbb_st *pcVar2;
  size_t local_60;
  size_t der_len;
  uint8_t *der;
  ScopedCBB cbb;
  EC_KEY *key_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_local;
  
  cbb.ctx_.u._24_8_ = key;
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
  pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
  iVar1 = CBB_init(pcVar2,0);
  if (iVar1 != 0) {
    pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
    key_00 = cbb.ctx_.u._24_8_;
    enc_flags = EC_KEY_get_enc_flags((EC_KEY *)cbb.ctx_.u._24_8_);
    iVar1 = EC_KEY_marshal_private_key(pcVar2,(EC_KEY *)key_00,enc_flags);
    if (iVar1 != 0) {
      pcVar2 = bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                         ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
      iVar1 = CBB_finish(pcVar2,(uint8_t **)&der_len,&local_60);
      if (iVar1 != 0) {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::assign<unsigned_char*,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,(uchar *)der_len,
                   (uchar *)(der_len + local_60));
        OPENSSL_free((void *)der_len);
        out_local._7_1_ = true;
        goto LAB_003fbe9f;
      }
    }
  }
  out_local._7_1_ = false;
LAB_003fbe9f:
  bssl::internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&der);
  return out_local._7_1_;
}

Assistant:

static bool EncodeECPrivateKey(std::vector<uint8_t> *out, const EC_KEY *key) {
  bssl::ScopedCBB cbb;
  uint8_t *der;
  size_t der_len;
  if (!CBB_init(cbb.get(), 0) ||
      !EC_KEY_marshal_private_key(cbb.get(), key, EC_KEY_get_enc_flags(key)) ||
      !CBB_finish(cbb.get(), &der, &der_len)) {
    return false;
  }
  out->assign(der, der + der_len);
  OPENSSL_free(der);
  return true;
}